

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)>::
PerformDefaultAction
          (FunctionMockerBase<MockProblemBuilder::MutCommonExpr_&(int)> *this,ArgumentTuple *args,
          string *call_description)

{
  OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)> *this_00;
  Action<MockProblemBuilder::MutCommonExpr_&(int)> *this_01;
  Result pMVar1;
  MutCommonExpr *pMVar2;
  runtime_error *this_02;
  string message;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)> *)0x0) {
    this_01 = OnCallSpec<MockProblemBuilder::MutCommonExpr_&(int)>::GetAction(this_00);
    pMVar1 = Action<MockProblemBuilder::MutCommonExpr_&(int)>::Perform(this_01,args);
    return pMVar1;
  }
  std::operator+(&message,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  if (DefaultValue<MockProblemBuilder::MutCommonExpr&>::address_ != 0) {
    pMVar2 = DefaultValue<MockProblemBuilder::MutCommonExpr_&>::Get();
    std::__cxx11::string::~string((string *)&message);
    return pMVar2;
  }
  this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_02,(string *)&message);
  __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Result PerformDefaultAction(const ArgumentTuple& args,
                              const string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != NULL) {
      return spec->GetAction().Perform(args);
    }
    const string message = call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }